

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

Mio_Pin_t * Mio_PinDup(Mio_Pin_t *pPin)

{
  char *__s;
  Mio_Pin_t *pMVar1;
  size_t sVar2;
  char *__dest;
  long lVar3;
  Mio_Pin_t *pMVar4;
  byte bVar5;
  
  bVar5 = 0;
  pMVar1 = (Mio_Pin_t *)malloc(0x50);
  pMVar4 = pMVar1;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pMVar4->pName = pPin->pName;
    pPin = (Mio_Pin_t *)((long)pPin + (ulong)bVar5 * -0x10 + 8);
    pMVar4 = (Mio_Pin_t *)((long)pMVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  __s = pMVar1->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,__s);
  }
  pMVar1->pName = __dest;
  pMVar1->pNext = (Mio_Pin_t *)0x0;
  return pMVar1;
}

Assistant:

Mio_Pin_t * Mio_PinDup( Mio_Pin_t * pPin )
{
    Mio_Pin_t * pPinNew;

    pPinNew = ABC_ALLOC( Mio_Pin_t, 1 );
    *pPinNew = *pPin;
    pPinNew->pName = (pPinNew->pName ? Abc_UtilStrsav(pPinNew->pName) : NULL);
    pPinNew->pNext = NULL;

    return pPinNew;
}